

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

OptionsType * __thiscall
google::protobuf::DescriptorBuilder::AllocateOptionsImpl<google::protobuf::OneofDescriptor>
          (DescriptorBuilder *this,string_view name_scope,string_view element_name,Proto *proto,
          Span<const_int> options_path,string_view option_name,FlatAllocator *alloc)

{
  PointerT<google::protobuf::OneofOptions> pOVar1;
  ulong uVar2;
  DescriptorPool *this_00;
  bool bVar3;
  char *failure_msg;
  Symbol SVar4;
  const_reference pUVar5;
  FieldDescriptor *pFVar6;
  MessageLite *to;
  undefined1 *opt;
  int iVar7;
  Symbol extendee;
  int i;
  int iVar8;
  RepeatedField<google::protobuf::UnknownField> *this_01;
  undefined1 *msg;
  string_view from;
  string_view element_name_00;
  OptionsToInterpret local_118;
  string local_b0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  to = (MessageLite *)element_name._M_len;
  bVar3 = OneofDescriptorProto::has_options(proto);
  opt = _OneofOptions_default_instance_;
  if (!bVar3) {
    return (OptionsType *)opt;
  }
  msg = (undefined1 *)(proto->field_0)._impl_.options_;
  if ((OneofOptions *)msg == (OneofOptions *)0x0) {
    msg = _OneofOptions_default_instance_;
  }
  if ((alloc->
      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ).pointers_.payload_.super_Base<char>.value == (PointerT<char>)0x0) {
    failure_msg = "has_allocated()";
    iVar8 = 0x1b0;
  }
  else {
    pOVar1 = (alloc->
             super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ).pointers_.payload_.super_Base<google::protobuf::OneofOptions>.value;
    iVar8 = (alloc->
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ).used_.payload_.super_Base<google::protobuf::OneofOptions>.value;
    iVar7 = iVar8 + 1;
    (alloc->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).used_.payload_.super_Base<google::protobuf::OneofOptions>.value = iVar7;
    failure_msg = absl::lts_20250127::log_internal::Check_LEImpl
                            (iVar7,(alloc->
                                   super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                                   ).total_.payload_.super_Base<google::protobuf::OneofOptions>.
                                   value,"used <= total_.template Get<TypeToUse>()");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      bVar3 = OneofOptions::IsInitializedImpl((MessageLite *)msg);
      if (bVar3) {
        opt = (undefined1 *)(pOVar1 + iVar8);
        MessageLite::SerializeAsString_abi_cxx11_(&local_118.name_scope,(MessageLite *)msg);
        from._M_str = opt;
        from._M_len = (size_t)local_118.name_scope._M_dataplus._M_p;
        bVar3 = internal::ParseNoReflection
                          ((internal *)local_118.name_scope._M_string_length,from,to);
        std::__cxx11::string::~string((string *)&local_118);
        if (!bVar3) {
          failure_msg = "parse_success";
          iVar8 = 0x16ba;
          goto LAB_00c223c2;
        }
        if (0 < *(int *)((long)&((OptionsType *)opt)->field_0 + 0x28)) {
          anon_unknown_24::OptionsToInterpret::OptionsToInterpret
                    (&local_118,name_scope,element_name,options_path,(Message *)msg,(Message *)opt);
          std::
          vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
          ::push_back(&this->options_to_interpret_,&local_118);
          anon_unknown_24::OptionsToInterpret::~OptionsToInterpret(&local_118);
        }
        uVar2 = (((OneofOptions *)msg)->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if ((uVar2 & 1) == 0) {
          this_01 = (RepeatedField<google::protobuf::UnknownField> *)
                    &UnknownFieldSet::default_instance()::instance;
        }
        else {
          this_01 = (RepeatedField<google::protobuf::UnknownField> *)
                    ((uVar2 & 0xfffffffffffffffe) + 8);
        }
        bVar3 = RepeatedField<google::protobuf::UnknownField>::empty(this_01);
        if ((!bVar3) &&
           (SVar4 = DescriptorPool::Tables::FindSymbol(this->tables_,option_name),
           (SVar4.ptr_)->symbol_type_ == '\x01')) {
          for (iVar8 = 0; iVar7 = RepeatedField<google::protobuf::UnknownField>::size(this_01),
              iVar8 < iVar7; iVar8 = iVar8 + 1) {
            assert_mutex_held(this->pool_);
            this_00 = this->pool_;
            extendee.ptr_ = &((Descriptor *)0x0)->super_SymbolBase;
            if ((SVar4.ptr_)->symbol_type_ == '\x01') {
              extendee = SVar4;
            }
            pUVar5 = RepeatedField<google::protobuf::UnknownField>::Get(this_01,iVar8);
            pFVar6 = DescriptorPool::InternalFindExtensionByNumberNoLock
                               (this_00,(Descriptor *)extendee.ptr_,pUVar5->number_);
            if (pFVar6 != (FieldDescriptor *)0x0) {
              local_118.name_scope._M_dataplus._M_p = (pointer)pFVar6->file_;
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
              ::erase<google::protobuf::FileDescriptor_const*>
                        ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
                          *)&this->unused_dependency_,
                         (key_arg<const_google::protobuf::FileDescriptor_*> *)&local_118);
            }
          }
        }
      }
      else {
        local_118.name_scope._M_dataplus._M_p = (pointer)name_scope._M_len;
        local_118.name_scope._M_string_length = (size_type)name_scope._M_str;
        local_60.piece_ = absl::lts_20250127::NullSafeStringView(".");
        local_90.piece_._M_len = element_name._M_len;
        local_90.piece_._M_str = element_name._M_str;
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_b0,(lts_20250127 *)&local_118,&local_60,&local_90,&local_60);
        element_name_00._M_str = local_b0._M_dataplus._M_p;
        element_name_00._M_len = local_b0._M_string_length;
        AddError(this,element_name_00,(Message *)msg,OPTION_NAME,
                 "Uninterpreted option is missing name or value.");
        std::__cxx11::string::~string((string *)&local_b0);
      }
      return (OptionsType *)opt;
    }
    iVar8 = 0x1b6;
  }
LAB_00c223c2:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_118,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
             ,iVar8,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_118)
  ;
}

Assistant:

const typename DescriptorT::OptionsType* DescriptorBuilder::AllocateOptionsImpl(
    absl::string_view name_scope, absl::string_view element_name,
    const typename DescriptorT::Proto& proto,
    absl::Span<const int> options_path, absl::string_view option_name,
    internal::FlatAllocator& alloc) {
  if (!proto.has_options()) {
    return &DescriptorT::OptionsType::default_instance();
  }
  const typename DescriptorT::OptionsType& orig_options = proto.options();

  auto* options = alloc.AllocateArray<typename DescriptorT::OptionsType>(1);

  if (!orig_options.IsInitialized()) {
    AddError(absl::StrCat(name_scope, ".", element_name), orig_options,
             DescriptorPool::ErrorCollector::OPTION_NAME,
             "Uninterpreted option is missing name or value.");
    return &DescriptorT::OptionsType::default_instance();
  }

  const bool parse_success =
      internal::ParseNoReflection(orig_options.SerializeAsString(), *options);
  ABSL_DCHECK(parse_success);

  // Don't add to options_to_interpret_ unless there were uninterpreted
  // options.  This not only avoids unnecessary work, but prevents a
  // bootstrapping problem when building descriptors for descriptor.proto.
  // descriptor.proto does not contain any uninterpreted options, but
  // attempting to interpret options anyway will cause
  // OptionsType::GetDescriptor() to be called which may then deadlock since
  // we're still trying to build it.
  if (options->uninterpreted_option_size() > 0) {
    options_to_interpret_.push_back(OptionsToInterpret(
        name_scope, element_name, options_path, &orig_options, options));
  }

  // If the custom option is in unknown fields, no need to interpret it.
  // Remove the dependency file from unused_dependency.
  const UnknownFieldSet& unknown_fields = orig_options.unknown_fields();
  if (!unknown_fields.empty()) {
    // Can not use options->GetDescriptor() which may case deadlock.
    Symbol msg_symbol = tables_->FindSymbol(option_name);
    if (msg_symbol.type() == Symbol::MESSAGE) {
      for (int i = 0; i < unknown_fields.field_count(); ++i) {
        assert_mutex_held(pool_);
        const FieldDescriptor* field =
            pool_->InternalFindExtensionByNumberNoLock(
                msg_symbol.descriptor(), unknown_fields.field(i).number());
        if (field) {
          unused_dependency_.erase(field->file());
        }
      }
    }
  }
  return options;
}